

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-power.c
# Opt level: O0

wchar_t element_power(object *obj,wchar_t p)

{
  uint uVar1;
  ulong uStack_28;
  wchar_t q;
  size_t j;
  size_t i;
  wchar_t p_local;
  object *obj_local;
  
  for (j = 0; j < 3; j = j + 1) {
    element_sets[j].count = 0;
  }
  i._4_4_ = p;
  for (j = 0; j < 0xd; j = j + 1) {
    if (((obj->el_info[j].flags & 2) != 0) && (el_powers[j].ignore_power != 0)) {
      i._4_4_ = el_powers[j].ignore_power + i._4_4_;
      log_obj("Add %d power for ignoring %s, total is %d\n",(ulong)(uint)el_powers[j].ignore_power,
              el_powers[j].name,(ulong)(uint)i._4_4_);
    }
    if (obj->el_info[j].res_level == -1) {
      if (el_powers[j].vuln_power != 0) {
        i._4_4_ = el_powers[j].vuln_power + i._4_4_;
        log_obj("Add %d power for vulnerability to %s, total is %d\n",
                (ulong)(uint)el_powers[j].vuln_power,el_powers[j].name,(ulong)(uint)i._4_4_);
      }
    }
    else if (obj->el_info[j].res_level == 1) {
      if (el_powers[j].res_power != 0) {
        i._4_4_ = el_powers[j].res_power + i._4_4_;
        log_obj("Add %d power for resistance to %s, total is %d\n",
                (ulong)(uint)el_powers[j].res_power,el_powers[j].name,(ulong)(uint)i._4_4_);
      }
    }
    else if ((obj->el_info[j].res_level == 3) && (el_powers[j].im_power != 0)) {
      uVar1 = el_powers[j].im_power + el_powers[j].res_power;
      i._4_4_ = uVar1 + i._4_4_;
      log_obj("Add %d power for immunity to %s, total is %d\n",(ulong)uVar1,el_powers[j].name,
              (ulong)(uint)i._4_4_);
    }
    for (uStack_28 = 0; uStack_28 < 3; uStack_28 = uStack_28 + 1) {
      if ((element_sets[uStack_28].type == el_powers[j].type) &&
         (element_sets[uStack_28].res_level <= (int)obj->el_info[j].res_level)) {
        element_sets[uStack_28].count = element_sets[uStack_28].count + 1;
      }
    }
  }
  for (j = 0; j < 3; j = j + 1) {
    if (1 < element_sets[j].count) {
      uVar1 = element_sets[j].factor * element_sets[j].count * element_sets[j].count;
      i._4_4_ = uVar1 + i._4_4_;
      log_obj("Add %d power for multiple %s, total is %d\n",(ulong)uVar1,element_sets[j].desc,
              (ulong)(uint)i._4_4_);
    }
    if (element_sets[j].count == element_sets[j].size) {
      i._4_4_ = element_sets[j].bonus + i._4_4_;
      log_obj("Add %d power for full set of %s, total is %d\n",(ulong)(uint)element_sets[j].bonus,
              element_sets[j].desc,(ulong)(uint)i._4_4_);
    }
  }
  return i._4_4_;
}

Assistant:

static int element_power(const struct object *obj, int p)
{
	size_t i, j;
	int q;

	/* Zero the set counts */
	for (i = 0; i < N_ELEMENTS(element_sets); i++)
		element_sets[i].count = 0;

	/* Analyse each element for ignore, vulnerability, resistance or immunity */
	for (i = 0; i < N_ELEMENTS(el_powers); i++) {
		if (obj->el_info[i].flags & EL_INFO_IGNORE) {
			if (el_powers[i].ignore_power != 0) {
				q = (el_powers[i].ignore_power);
				p += q;
				log_obj("Add %d power for ignoring %s, total"
					" is %d\n", q, el_powers[i].name, p);
			}
		}

		if (obj->el_info[i].res_level == -1) {
			if (el_powers[i].vuln_power != 0) {
				q = (el_powers[i].vuln_power);
				p += q;
				log_obj("Add %d power for vulnerability to"
					" %s, total is %d\n", q,
					el_powers[i].name, p);
			}
		} else if (obj->el_info[i].res_level == 1) {
			if (el_powers[i].res_power != 0) {
				q = (el_powers[i].res_power);
				p += q;
				log_obj("Add %d power for resistance to"
					" %s, total is %d\n", q,
					el_powers[i].name, p);
			}
		} else if (obj->el_info[i].res_level == 3) {
			if (el_powers[i].im_power != 0) {
				q = (el_powers[i].im_power + el_powers[i].res_power);
				p += q;
				log_obj("Add %d power for immunity to"
					" %s, total is %d\n", q,
					el_powers[i].name, p);
			}
		}

		/* Track combinations of element properties */
		for (j = 0; j < N_ELEMENTS(element_sets); j++)
			if ((element_sets[j].type == el_powers[i].type) &&
				(element_sets[j].res_level <= obj->el_info[i].res_level))
				element_sets[j].count++;
	}

	/* Add extra power for multiple flags of the same type */
	for (i = 0; i < N_ELEMENTS(element_sets); i++) {
		if (element_sets[i].count > 1) {
			q = (element_sets[i].factor * element_sets[i].count * element_sets[i].count);
			p += q;
			log_obj("Add %d power for multiple %s, total is %d\n",
				q, element_sets[i].desc, p);
		}

		/* Add bonus if item has a full set of these flags */
		if (element_sets[i].count == element_sets[i].size) {
			q = element_sets[i].bonus;
			p += q;
			log_obj("Add %d power for full set of %s,"
				" total is %d\n", q, element_sets[i].desc, p);
		}
	}

	return p;
}